

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  StringRef macroName;
  bool bVar1;
  void *in_RCX;
  AssertionResult *in_RDI;
  MessageBuilder builder;
  AssertionResult *in_stack_fffffffffffffef8;
  AssertionResult *in_stack_ffffffffffffff00;
  MessageBuilder *this_00;
  OfType type;
  undefined1 in_stack_ffffffffffffff28 [16];
  StringRef *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffff48;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffff50;
  string local_68 [72];
  void *local_20;
  
  local_20 = in_RCX;
  AssertionResult::AssertionResult(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  type = (OfType)((ulong)(in_RDI + 1) >> 0x20);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  memcpy(&in_RDI[1].m_info.lineInfo.line,local_20,0x40);
  bVar1 = AssertionResult::hasMessage((AssertionResult *)0x184961);
  if (bVar1) {
    AssertionResult::getTestMacroName(in_RDI);
    AssertionResult::getSourceInfo(in_RDI);
    AssertionResult::getResultType(in_RDI);
    macroName.m_size = (size_type)in_stack_ffffffffffffff40;
    macroName.m_start = (char *)in_stack_ffffffffffffff38;
    MessageBuilder::MessageBuilder
              (in_stack_ffffffffffffff28._8_8_,macroName,in_stack_ffffffffffffff28._0_8_,type);
    AssertionResult::getMessage((AssertionResult *)0x1849c7);
    StringRef::operator_cast_to_string(in_stack_ffffffffffffff38);
    this_00 = (MessageBuilder *)&stack0xffffffffffffff38;
    std::__cxx11::string::operator=(local_68,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_00,
               (value_type *)in_stack_fffffffffffffef8);
    MessageBuilder::~MessageBuilder(this_00);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                    std::vector<MessageInfo> const& _infoMessages,
                                    Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder.m_info.message = static_cast<std::string>(assertionResult.getMessage());

            infoMessages.push_back( CATCH_MOVE(builder.m_info) );
        }
    }